

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CsvHelper.cpp
# Opt level: O0

int CsvHelper::read_string(char *text,int text_max,size_t start,char *buffer,size_t buffer_max)

{
  char *pcVar1;
  bool bVar2;
  int local_34;
  int x;
  size_t buffer_max_local;
  char *buffer_local;
  size_t start_local;
  int text_max_local;
  char *text_local;
  
  local_34 = 0;
  buffer_local = (char *)start;
  while( true ) {
    bVar2 = false;
    if ((buffer_local < buffer_max) && (bVar2 = true, buffer[(long)buffer_local] != ' ')) {
      bVar2 = buffer[(long)buffer_local] == '\t';
    }
    if (!bVar2) break;
    buffer_local = buffer_local + 1;
  }
  if ((buffer_local < buffer_max) && (buffer[(long)buffer_local] == '\"')) {
    buffer_local = buffer_local + 1;
    while( true ) {
      bVar2 = false;
      if (buffer_local < buffer_max) {
        bVar2 = buffer[(long)buffer_local] != '\0';
      }
      pcVar1 = buffer_local;
      if (!bVar2) break;
      if (buffer[(long)buffer_local] == '\"') {
        pcVar1 = buffer_local + 1;
        if ((buffer_max <= pcVar1) || (buffer[(long)pcVar1] != '\"')) break;
        if (local_34 < text_max + -1) {
          text[local_34] = buffer[(long)pcVar1];
          local_34 = local_34 + 1;
        }
        buffer_local = buffer_local + 2;
      }
      else {
        if (local_34 < text_max + -1) {
          text[local_34] = buffer[(long)buffer_local];
          local_34 = local_34 + 1;
        }
        buffer_local = buffer_local + 1;
      }
    }
  }
  else {
    while( true ) {
      bVar2 = false;
      if ((buffer_local < buffer_max) && (bVar2 = false, buffer[(long)buffer_local] != '\0')) {
        bVar2 = buffer[(long)buffer_local] != ',';
      }
      pcVar1 = buffer_local;
      if (!bVar2) break;
      if (local_34 < text_max + -1) {
        text[local_34] = buffer[(long)buffer_local];
        local_34 = local_34 + 1;
      }
      buffer_local = buffer_local + 1;
    }
  }
  buffer_local = pcVar1;
  text[local_34] = '\0';
  do {
    if (buffer_max <= buffer_local) {
LAB_001fea28:
      return (int)buffer_local;
    }
    if (buffer[(long)buffer_local] == ',') {
      buffer_local = buffer_local + 1;
      goto LAB_001fea28;
    }
    if ((buffer[(long)buffer_local] != ' ') && (buffer[(long)buffer_local] != '\t'))
    goto LAB_001fea28;
    buffer_local = buffer_local + 1;
  } while( true );
}

Assistant:

int CsvHelper::read_string(char* text, int text_max, size_t start, char const * buffer, size_t buffer_max)
{
    int x = 0;

    /* Skip blanks */
    while (start < buffer_max && (buffer[start] == ' ' || buffer[start] == '\t'))
    {
        start++;
    }

    /* If quoted, copy quoted, else copy */
    if (start < buffer_max && buffer[start] == '"')
    {
#if 0
        if (x < (text_max - 1))
        {
            text[x] = buffer[start];
            x++;
        }
#endif
        start++;
        while (start < buffer_max && buffer[start] != 0)
        {
            if (buffer[start] == '"')
            {
#if 0
                /* Copy the quote and skip it. */
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
#endif
                start++;
                /* Test whether there is a double quote */
                if (start < buffer_max && buffer[start] == '"')
                {
                    /* copy the double quote and continue */
                    if (x < (text_max - 1))
                    {
                        text[x] = buffer[start];
                        x++;
                    }
                    start++;
                }
                else
                {
                    /* This was the final quote */
                    break;
                }
            }
            else
            {
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
                start++;
            }
        }
    }
    else
    {
        while (start < buffer_max && buffer[start] != 0 && buffer[start] != ',')
        {
            if (x < (text_max - 1))
            {
                text[x] = buffer[start];
                x++;
            }
            start++;
        }
    }
    text[x] = 0;

    /* Skip comma */
    while (start < buffer_max)
    {
        if (buffer[start] == ',')
        {
            start++;
            break;
        }
        else if (buffer[start] == ' ' || buffer[start] == '\t')
        {
            start++;
        }
        else
        {
            break;
        }
    }

    return (int)start;
}